

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector.h
# Opt level: O1

int __thiscall gmath::DVector<double>::init(DVector<double> *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int extraout_EAX;
  double *__s;
  void *pvVar1;
  ulong __n;
  
  if (this->v != (double *)0x0) {
    operator_delete__(this->v);
    in_EAX = extraout_EAX;
  }
  this->n = (int)ctx;
  this->v = (double *)0x0;
  if (0 < (int)ctx) {
    __n = ((ulong)ctx & 0xffffffff) << 3;
    __s = (double *)operator_new__(__n);
    this->v = __s;
    pvVar1 = memset(__s,0,__n);
    return (int)pvVar1;
  }
  return in_EAX;
}

Assistant:

void init(int len)
    {
      if (v != 0)
      {
        delete [] v;
      }

      n=len;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=0;
        }
      }
    }